

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Video::~Video(Video *this)

{
  ~Video(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

Video::~Video()
{
    if(content) {
        delete[] content;
    }
}